

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task26.cpp
# Opt level: O3

void resize(IntArray *arr,int newSize)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar5 = 0xffffffffffffffff;
  if (-1 < newSize) {
    uVar5 = (ulong)(uint)newSize << 2;
  }
  piVar3 = (int *)operator_new__(uVar5);
  uVar2 = arr->size;
  uVar4 = newSize;
  if ((int)uVar2 < newSize) {
    uVar4 = uVar2;
  }
  piVar1 = arr->data;
  if ((int)uVar4 < 1) {
    if (piVar1 == (int *)0x0) goto LAB_0010146a;
  }
  else {
    uVar5 = 0;
    do {
      piVar3[uVar5] = piVar1[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  operator_delete__(piVar1);
  uVar2 = arr->size;
LAB_0010146a:
  arr->data = piVar3;
  if ((int)uVar2 < newSize) {
    memset(piVar3 + (int)uVar2,0,(ulong)(~uVar2 + newSize) * 4 + 4);
  }
  arr->size = newSize;
  return;
}

Assistant:

void resize(IntArray* arr, int newSize){
    int* new_arr = new int [newSize];
    for (int i = 0; i < min(newSize, arr->size); i++) new_arr[i] = arr->data[i];
    delete[]arr->data;
    arr->data = new_arr;
    if (newSize > arr->size) for (int i = arr->size; i < newSize; i++) arr->data[i] = 0;
    arr->size = newSize;
}